

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O0

ON_RenderChannels * __thiscall
ON_RenderChannels::operator=(ON_RenderChannels *this,ON_RenderChannels *rch)

{
  uint uVar1;
  undefined1 local_30 [8];
  ON_SimpleArray<ON_UUID_struct> chan;
  ON_RenderChannels *rch_local;
  ON_RenderChannels *this_local;
  
  if (this != rch) {
    chan._16_8_ = rch;
    uVar1 = (*rch->_vptr_ON_RenderChannels[5])();
    (*this->_vptr_ON_RenderChannels[6])(this,(ulong)uVar1);
    ON_SimpleArray<ON_UUID_struct>::ON_SimpleArray((ON_SimpleArray<ON_UUID_struct> *)local_30);
    (**(code **)(*(long *)chan._16_8_ + 0x38))
              (chan._16_8_,(ON_SimpleArray<ON_UUID_struct> *)local_30);
    (*this->_vptr_ON_RenderChannels[8])(this,local_30);
    ON_SimpleArray<ON_UUID_struct>::~ON_SimpleArray((ON_SimpleArray<ON_UUID_struct> *)local_30);
  }
  return this;
}

Assistant:

const ON_RenderChannels& ON_RenderChannels::operator = (const ON_RenderChannels& rch)
{
  if (this != &rch)
  {
    SetMode(rch.Mode());

    ON_SimpleArray<ON_UUID> chan;
    rch.GetCustomList(chan);
    SetCustomList(chan);
  }

  return *this;
}